

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDynamicLoader.cxx
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_812be::cmDynamicLoaderCache::GetCacheFile
          (cmDynamicLoaderCache *this,char *path,LibraryHandle *p)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_70 [3];
  allocator<char> local_51;
  key_type local_50;
  _Self local_30;
  iterator it;
  LibraryHandle *p_local;
  char *path_local;
  cmDynamicLoaderCache *this_local;
  
  it._M_node = (_Base_ptr)p;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,path,&local_51);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::find(&this->CacheMap,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
       ::end(&this->CacheMap);
  bVar1 = std::operator!=(&local_30,local_70);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
             ::operator->(&local_30);
    *(void **)it._M_node = ppVar2->second;
  }
  return bVar1;
}

Assistant:

bool cmDynamicLoaderCache::GetCacheFile(const char* path,
                                        cmsys::DynamicLoader::LibraryHandle& p)
{
  auto it = this->CacheMap.find(path);
  if (it != this->CacheMap.end()) {
    p = it->second;
    return true;
  }
  return false;
}